

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeDataSegmentBoundsCheck
          (Replacer *this,MemoryInit *curr,Index sizeIdx,Index offsetIdx)

{
  DataSegment *pDVar1;
  LocalGet *leftOperand;
  LocalGet *rightOperand;
  size_type val;
  Const *limit;
  Expression *pEVar2;
  Expression *addGtuTrap;
  DataSegment *segment;
  Index offsetIdx_local;
  Index sizeIdx_local;
  MemoryInit *curr_local;
  Replacer *this_local;
  
  pDVar1 = Module::getDataSegment(this->parent->wasm,(Name)(curr->segment).super_IString.str);
  leftOperand = Builder::makeLocalGet(&this->builder,offsetIdx,(Type)(this->parent->pointerType).id)
  ;
  rightOperand = Builder::makeLocalGet(&this->builder,sizeIdx,(Type)(this->parent->pointerType).id);
  val = std::vector<char,_std::allocator<char>_>::size(&pDVar1->data);
  limit = Builder::makeConstPtr(&this->builder,val,(Type)(this->parent->pointerType).id);
  pEVar2 = makeAddGtuTrap(this,(Expression *)leftOperand,(Expression *)rightOperand,
                          (Expression *)limit);
  return pEVar2;
}

Assistant:

Expression* makeDataSegmentBoundsCheck(MemoryInit* curr,
                                           Index sizeIdx,
                                           Index offsetIdx) {
      auto* segment = parent.wasm->getDataSegment(curr->segment);
      Expression* addGtuTrap = makeAddGtuTrap(
        builder.makeLocalGet(offsetIdx, parent.pointerType),
        builder.makeLocalGet(sizeIdx, parent.pointerType),
        builder.makeConstPtr(segment->data.size(), parent.pointerType));
      return addGtuTrap;
    }